

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

quad_value_bit_vector * bsim::xorr(quad_value_bit_vector *a)

{
  bool bVar1;
  int iVar2;
  quad_value_bit_vector *in_RSI;
  quad_value_bit_vector *in_RDI;
  int i;
  int numSet;
  quad_value_bit_vector *in_stack_ffffffffffffff58;
  allocator *paVar3;
  quad_value *in_stack_ffffffffffffff60;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [16];
  string *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe0;
  quad_value in_stack_ffffffffffffffe7;
  int local_18;
  int local_14;
  
  local_14 = 0;
  for (local_18 = 0; iVar2 = quad_value_bit_vector::bitLength(in_RSI), local_18 < iVar2;
      local_18 = local_18 + 1) {
    in_stack_ffffffffffffffe7 = quad_value_bit_vector::get(in_stack_ffffffffffffff58,0);
    quad_value::quad_value
              (in_stack_ffffffffffffff60,(uchar)((ulong)in_stack_ffffffffffffff58 >> 0x38));
    bVar1 = operator==(in_stack_ffffffffffffff60,(quad_value *)in_stack_ffffffffffffff58);
    if (bVar1) {
      local_14 = local_14 + 1;
    }
  }
  if (local_14 % 2 == 0) {
    paVar3 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"0",paVar3);
    quad_value_bit_vector::quad_value_bit_vector
              ((quad_value_bit_vector *)
               CONCAT17(in_stack_ffffffffffffffe7.value,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    paVar3 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"1",paVar3);
    quad_value_bit_vector::quad_value_bit_vector
              ((quad_value_bit_vector *)
               CONCAT17(in_stack_ffffffffffffffe7.value,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return in_RDI;
}

Assistant:

static inline quad_value_bit_vector
  xorr(const quad_value_bit_vector& a) {
    int numSet = 0;
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) == 1) {
	numSet++;
      }
    }

    if ((numSet % 2) == 0) {
      return quad_value_bit_vector(1, "0");
    }

    return quad_value_bit_vector(1, "1");
  }